

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

void __thiscall absl::lts_20250127::Mutex::AssertHeld(Mutex *this)

{
  SynchEvent *pSVar1;
  char *local_58;
  char *absl_raw_log_internal_basename;
  SynchEvent *e;
  Mutex *this_local;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  if (((this->mu_).super___atomic_base<long>._M_i & 8U) != 0) {
    return;
  }
  pSVar1 = GetSynchEvent(this);
  if (pSVar1 == (SynchEvent *)0x0) {
    local_58 = "";
  }
  else {
    local_58 = pSVar1->name;
  }
  raw_log_internal::RawLog
            (kFatal,"mutex.cc",0x9c4,"thread should hold write lock on Mutex %p %s",this,local_58);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/synchronization/mutex.cc"
                ,0x9c4,"void absl::Mutex::AssertHeld() const");
}

Assistant:

void Mutex::AssertHeld() const {
  if ((mu_.load(std::memory_order_relaxed) & kMuWriter) == 0) {
    SynchEvent* e = GetSynchEvent(this);
    ABSL_RAW_LOG(FATAL, "thread should hold write lock on Mutex %p %s",
                 static_cast<const void*>(this), (e == nullptr ? "" : e->name));
  }
}